

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O0

void __thiscall NaTextStreamFile::SetValue(NaTextStreamFile *this,NaReal fVal,int iVar)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 *puVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  int in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  int i_1;
  int nOld;
  NaReal *pOld;
  int i;
  int local_28;
  int local_18;
  
  if (*(long *)(in_RDI + 0x28) != -1) {
    if (*(int *)(in_RDI + 0x43c) == 0) {
      *(int *)(in_RDI + 0x43c) = in_ESI + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)*(int *)(in_RDI + 0x43c);
      uVar5 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5);
      *(void **)(in_RDI + 0x30) = pvVar6;
      for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x43c); local_18 = local_18 + 1) {
        if (local_18 == in_ESI) {
          *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_18 * 8) = in_XMM0_Qa;
        }
        else {
          *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_18 * 8) = 0;
        }
      }
    }
    else if (in_ESI < *(int *)(in_RDI + 0x43c)) {
      *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 8) = in_XMM0_Qa;
    }
    else if (*(int *)(in_RDI + 0x43c) <= in_ESI) {
      pvVar6 = *(void **)(in_RDI + 0x30);
      iVar1 = *(int *)(in_RDI + 0x43c);
      *(int *)(in_RDI + 0x43c) = in_ESI + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)*(int *)(in_RDI + 0x43c);
      uVar5 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar5);
      *(void **)(in_RDI + 0x30) = pvVar7;
      for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x43c); local_28 = local_28 + 1) {
        if (local_28 < iVar1) {
          *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_28 * 8) =
               *(undefined8 *)((long)pvVar6 + (long)local_28 * 8);
        }
        else if (local_28 == in_ESI) {
          *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_28 * 8) = in_XMM0_Qa;
        }
        else {
          *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_28 * 8) = 0;
        }
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 1;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void    NaTextStreamFile::SetValue (NaReal fVal, int iVar)
{
    if(-1 == iCase)
        throw(na_out_of_range);

    if(0 == nVar){
        // Number of values in record is not defined yet
        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
    }else if(iVar < nVar){
        // Setting variable among known ones
        fCurVal[iVar] = fVal;
    }else if(iVar >= nVar){
        // Setting variable beyond known ones
        NaReal      *pOld = fCurVal;
        int    nOld = nVar;

        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i < nOld){
                fCurVal[i] = pOld[i];
            }else if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
        delete[] pOld;
    }
}